

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
boost::exception_detail::error_info_injector<boost::condition_error>::error_info_injector
          (error_info_injector<boost::condition_error> *this,condition_error *x)

{
  condition_error *in_RDI;
  exception *in_stack_ffffffffffffffe0;
  
  condition_error::condition_error((condition_error *)in_stack_ffffffffffffffe0,in_RDI);
  exception::exception(in_stack_ffffffffffffffe0);
  *(undefined ***)&in_RDI->super_system_error = &PTR__error_info_injector_00305a60;
  *(undefined ***)&in_RDI[1].super_system_error = &PTR__error_info_injector_00305a88;
  return;
}

Assistant:

explicit
            error_info_injector( T const & x ):
                T(x)
                {
                }